

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void PerlinNoiseTest<Blob<128>>
               (int Xbits,int Ybits,int inputLen,int step,pfHash hash,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  uint in_EDX;
  byte in_SIL;
  byte in_DIL;
  code *in_R8;
  Blob<128> h;
  int y;
  int x;
  char key [256];
  int yMax;
  int xMax;
  undefined1 local_140 [8];
  value_type *in_stack_fffffffffffffec8;
  int iVar1;
  int iVar2;
  undefined1 local_128 [256];
  int local_28;
  int local_24;
  code *local_18;
  uint local_c;
  
  local_24 = 1 << (in_DIL & 0x1f);
  local_28 = 1 << (in_SIL & 0x1f);
  local_18 = in_R8;
  local_c = in_EDX;
  memset(local_128,0,0x100);
  printf("Testing %i coordinates (L%i) : \n",(ulong)(uint)(local_24 * local_28),(ulong)local_c);
  for (iVar2 = 0; iVar2 < local_24; iVar2 = iVar2 + 1) {
    memcpy(local_128,&stack0xfffffffffffffed4,(long)(int)local_c);
    for (iVar1 = 0; iVar1 < local_28; iVar1 = iVar1 + 1) {
      Blob<128>::Blob((Blob<128> *)local_140);
      (*local_18)(local_128,local_c,iVar1,local_140);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
                ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(iVar2,iVar1),
                 in_stack_fffffffffffffec8);
    }
  }
  return;
}

Assistant:

void PerlinNoiseTest (int Xbits, int Ybits,
                      int inputLen, int step,
                      pfHash hash, std::vector<hashtype> & hashes )
{
  assert(0 < Ybits && Ybits < 31);
  assert(0 < Xbits && Xbits < 31);
  assert(inputLen*8 > Xbits);  // enough space to run the test

  int const xMax = (1 << Xbits);
  int const yMax = (1 << Ybits);

  assert(Xbits + Ybits < 31);

#define INPUT_LEN_MAX 256
  assert(inputLen <= INPUT_LEN_MAX);
  char key[INPUT_LEN_MAX] = {0};

  printf("Testing %i coordinates (L%i) : \n", xMax * yMax, inputLen);

  for(int x = 0; x < xMax; x++) {
      memcpy(key, &x, inputLen);  // Note : only works with Little Endian
      for (int y=0; y < yMax; y++) {
          hashtype h;
          hash(key, inputLen, y, &h);
          hashes.push_back(h);
      }
  }
}